

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O1

bool __thiscall
icu_63::number::impl::NumberStringBuilder::containsField(NumberStringBuilder *this,Field field)

{
  ulong uVar1;
  ulong uVar2;
  ValueOrHeapArray<UNumberFormatFields> *pVVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = (ulong)this->fLength;
  bVar5 = 0 < (long)uVar2;
  if (0 < (long)uVar2) {
    if (this->fUsingHeap == false) {
      pVVar3 = &this->fFields;
    }
    else {
      pVVar3 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
    }
    if (pVVar3->value[this->fZero] != field) {
      uVar1 = 1;
      do {
        uVar4 = uVar1;
        if (uVar2 == uVar4) break;
        uVar1 = uVar4 + 1;
      } while (*(Field *)((long)pVVar3 + uVar4 * 4 + (long)this->fZero * 4) != field);
      bVar5 = uVar4 < uVar2;
    }
  }
  return bVar5;
}

Assistant:

bool NumberStringBuilder::containsField(Field field) const {
    for (int32_t i = 0; i < fLength; i++) {
        if (field == fieldAt(i)) {
            return true;
        }
    }
    return false;
}